

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

int * __thiscall
dnet::data_types::tensor<int,_3U>::operator[](tensor<int,_3U> *this,array<unsigned_int,_3UL> *i)

{
  bool bVar1;
  int iVar2;
  size_t t;
  long lVar3;
  exception *__return_storage_ptr__;
  allocator local_66;
  allocator local_65;
  axes_type ii;
  string local_58;
  string local_38;
  
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    ii._M_elems[(this->_axes_sort)._M_elems[lVar3]] = i->_M_elems[lVar3];
  }
  bVar1 = check(this,i);
  if (bVar1) {
    iVar2 = to_index(this,&ii);
    return (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + iVar2;
  }
  __return_storage_ptr__ = (exception *)__cxa_allocate_exception(0x40);
  std::__cxx11::string::string((string *)&local_38,"matrix",&local_65);
  std::__cxx11::string::string((string *)&local_58,"Index out of range.",&local_66);
  misc::make_error(__return_storage_ptr__,&local_38,&local_58);
  __cxa_throw(__return_storage_ptr__,&misc::exception::typeinfo,misc::exception::~exception);
}

Assistant:

T &tensor<T, N>::operator[](const std::array<index_type, N> &i)
        {
            axes_type ii;
            for (size_t t = 0; t < i.size(); t++)
                ii[this->_axes_sort[t]] = i[t];
            if (!this->check(i)) {
                throw misc::make_error("matrix", "Index out of range.");
            }
            return this->_data[this->to_index(ii)];
        }